

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::GetMissileDamage(AActor *this,int mask,int add)

{
  uint uVar1;
  int iVar2;
  VMFrameStack *this_00;
  int local_44;
  undefined1 local_40 [4];
  int amount;
  VMReturn result;
  VMValue param;
  int add_local;
  int mask_local;
  AActor *this_local;
  
  if (this->DamageVal < 0) {
    if (this->DamageFunc == (VMFunction *)0x0) {
      __assert_fail("false && \"No damage function found\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xd24,"int AActor::GetMissileDamage(int, int)");
    }
    VMValue::VMValue((VMValue *)&result.TagOfs,(DObject *)this);
    VMReturn::IntAt((VMReturn *)local_40,&local_44);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    iVar2 = VMFrameStack::Call(this_00,this->DamageFunc,(VMValue *)&result.TagOfs,1,
                               (VMReturn *)local_40,1,(VMException **)0x0);
    if (iVar2 < 1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = local_44;
    }
    VMValue::~VMValue((VMValue *)&result.TagOfs);
  }
  else if (mask == 0) {
    this_local._4_4_ = add * this->DamageVal;
  }
  else {
    uVar1 = FRandom::operator()(&pr_missiledamage);
    this_local._4_4_ = ((uVar1 & mask) + add) * this->DamageVal;
  }
  return this_local._4_4_;
}

Assistant:

int AActor::GetMissileDamage (int mask, int add)
{
	if (DamageVal >= 0)
	{
		if (mask == 0)
		{
			return add * DamageVal;
		}
		else
		{
			return ((pr_missiledamage() & mask) + add) * DamageVal;
		}
	}
	if (DamageFunc == nullptr)
	{
		// This should never happen
		assert(false && "No damage function found");
		return 0;
	}
	VMValue param = this;
	VMReturn result;

	int amount;

	result.IntAt(&amount);

	if (GlobalVMStack.Call(DamageFunc, &param, 1, &result, 1) < 1)
	{ // No results
		return 0;
	}
	return amount;
}